

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::CheckSectorTransition(AActor *this,sector_t *oldsec)

{
  bool bVar1;
  ASectorAction *pAVar2;
  double dVar3;
  double dVar4;
  uint local_1c;
  int act;
  sector_t *oldsec_local;
  AActor *this_local;
  
  if (oldsec != this->Sector) {
    bVar1 = TObjPtr<ASectorAction>::operator!=(&oldsec->SecActTarget,(ASectorAction *)0x0);
    if (bVar1) {
      pAVar2 = TObjPtr<ASectorAction>::operator->(&oldsec->SecActTarget);
      ASectorAction::TriggerAction(pAVar2,this,2);
    }
    bVar1 = TObjPtr<ASectorAction>::operator!=(&this->Sector->SecActTarget,(ASectorAction *)0x0);
    if (bVar1) {
      local_1c = 1;
      dVar4 = Z(this);
      dVar3 = secplane_t::ZatPoint(&this->Sector->floorplane,this);
      if (dVar4 <= dVar3) {
        local_1c = 5;
      }
      dVar4 = Top(this);
      dVar3 = secplane_t::ZatPoint(&this->Sector->ceilingplane,this);
      if (dVar3 <= dVar4) {
        local_1c = local_1c | 8;
      }
      if (this->Sector->heightsec != (sector_t *)0x0) {
        dVar4 = Z(this);
        dVar3 = secplane_t::ZatPoint(&this->Sector->heightsec->floorplane,this);
        if ((dVar4 == dVar3) && (!NAN(dVar4) && !NAN(dVar3))) {
          local_1c = local_1c | 0x400;
        }
      }
      pAVar2 = TObjPtr<ASectorAction>::operator->(&this->Sector->SecActTarget);
      ASectorAction::TriggerAction(pAVar2,this,local_1c);
    }
    dVar4 = Z(this);
    if ((dVar4 == this->floorz) && (!NAN(dVar4) && !NAN(this->floorz))) {
      dVar4 = Z(this);
      P_CheckFor3DFloorHit(this,dVar4);
    }
    dVar4 = Top(this);
    if ((dVar4 == this->ceilingz) && (!NAN(dVar4) && !NAN(this->ceilingz))) {
      dVar4 = Top(this);
      P_CheckFor3DCeilingHit(this,dVar4);
    }
  }
  return;
}

Assistant:

void AActor::CheckSectorTransition(sector_t *oldsec)
{
	if (oldsec != Sector)
	{
		if (oldsec->SecActTarget != NULL)
		{
			oldsec->SecActTarget->TriggerAction(this, SECSPAC_Exit);
		}
		if (Sector->SecActTarget != NULL)
		{
			int act = SECSPAC_Enter;
			if (Z() <= Sector->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFloor;
			}
			if (Top() >= Sector->ceilingplane.ZatPoint(this))
			{
				act |= SECSPAC_HitCeiling;
			}
			if (Sector->heightsec != NULL && Z() == Sector->heightsec->floorplane.ZatPoint(this))
			{
				act |= SECSPAC_HitFakeFloor;
			}
			Sector->SecActTarget->TriggerAction(this, act);
		}
		if (Z() == floorz)
		{
			P_CheckFor3DFloorHit(this, Z());
		}
		if (Top() == ceilingz)
		{
			P_CheckFor3DCeilingHit(this, Top());
		}
	}
}